

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

TypedExpectation<bool_()> * __thiscall
testing::internal::TypedExpectation<bool_()>::WillRepeatedly
          (TypedExpectation<bool_()> *this,Action<bool_()> *action)

{
  Clause CVar1;
  bool bVar2;
  size_type sVar3;
  Cardinality local_88;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  Action<bool_()> *local_18;
  Action<bool_()> *action_local;
  TypedExpectation<bool_()> *this_local;
  
  local_18 = action;
  action_local = (Action<bool_()> *)this;
  if ((this->super_ExpectationBase).last_clause_ == kWillRepeatedly) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_38,
               ".WillRepeatedly() cannot appear more than once in an EXPECT_CALL().",&local_39);
    ExpectationBase::ExpectSpecProperty(&this->super_ExpectationBase,false,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    CVar1 = (this->super_ExpectationBase).last_clause_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_70,".WillRepeatedly() cannot appear after .RetiresOnSaturation().",
               &local_71);
    ExpectationBase::ExpectSpecProperty(&this->super_ExpectationBase,(int)CVar1 < 6,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  (this->super_ExpectationBase).last_clause_ = kWillRepeatedly;
  (this->super_ExpectationBase).repeated_action_specified_ = true;
  Action<bool_()>::operator=(&this->repeated_action_,local_18);
  bVar2 = ExpectationBase::cardinality_specified(&this->super_ExpectationBase);
  if (!bVar2) {
    sVar3 = std::vector<const_void_*,_std::allocator<const_void_*>_>::size
                      (&(this->super_ExpectationBase).untyped_actions_);
    AtLeast((testing *)&local_88,(int)sVar3);
    ExpectationBase::set_cardinality(&this->super_ExpectationBase,&local_88);
    Cardinality::~Cardinality(&local_88);
  }
  ExpectationBase::CheckActionCountIfNotDone(&this->super_ExpectationBase);
  return this;
}

Assistant:

TypedExpectation& WillRepeatedly(const Action<F>& action) {
    if (last_clause_ == kWillRepeatedly) {
      ExpectSpecProperty(false,
                         ".WillRepeatedly() cannot appear "
                         "more than once in an EXPECT_CALL().");
    } else {
      ExpectSpecProperty(last_clause_ < kWillRepeatedly,
                         ".WillRepeatedly() cannot appear "
                         "after .RetiresOnSaturation().");
    }
    last_clause_ = kWillRepeatedly;
    repeated_action_specified_ = true;

    repeated_action_ = action;
    if (!cardinality_specified()) {
      set_cardinality(AtLeast(static_cast<int>(untyped_actions_.size())));
    }

    // Now that no more action clauses can be specified, we check
    // whether their count makes sense.
    CheckActionCountIfNotDone();
    return *this;
  }